

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_booke206_tlbilx1_ppc(CPUPPCState_conflict *env,target_ulong_conflict address)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ppc6xx_tlb_t_conflict *ppVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = env->spr[0x276];
  ppVar4 = (env->tlb).tlb6;
  uVar5 = 0;
  do {
    uVar2 = env->spr[uVar5 + 0x2b0];
    if ((uVar2 & 0xfff) != 0) {
      lVar6 = 0;
      do {
        uVar3 = *(uint *)((long)&ppVar4->pte1 + lVar6);
        if (((uVar3 >> 0x1e & 1) == 0) && (((uVar3 ^ uVar1) & 0x3fff0000) == 0)) {
          *(uint *)((long)&ppVar4->pte1 + lVar6) = uVar3 & 0x3fffffff;
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)((uVar2 & 0xfff) << 3) * 3 != lVar6);
    }
    ppVar4 = ppVar4 + (ulong)(env->spr[uVar5 | 0x2b0] & 0xfff) * 2;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 4);
  tlb_flush_ppc((CPUState_conflict *)&env[-1].spr_cb[0x1b7].hea_write);
  return;
}

Assistant:

void helper_booke206_tlbilx1(CPUPPCState *env, target_ulong address)
{
    int i, j;
    int tid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID);
    ppcmas_tlb_t *tlb = env->tlb.tlbm;
    int tlb_size;

    /* XXX missing LPID handling */
    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        tlb_size = booke206_tlb_size(env, i);
        for (j = 0; j < tlb_size; j++) {
            if (!(tlb[j].mas1 & MAS1_IPROT) &&
                ((tlb[j].mas1 & MAS1_TID_MASK) == tid)) {
                tlb[j].mas1 &= ~MAS1_VALID;
            }
        }
        tlb += booke206_tlb_size(env, i);
    }
    tlb_flush(env_cpu(env));
}